

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::GeneratorBailIn::~GeneratorBailIn(GeneratorBailIn *this)

{
  SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount> *this_00;
  JitArenaAllocator *pJVar1;
  Type_conflict pSVar2;
  bool bVar3;
  Type_conflict *ppSVar4;
  long *plVar5;
  long extraout_RDX;
  code *local_68;
  GeneratorBailIn *this_local;
  FreeFuncType freeFunc;
  NodeBase *next;
  NodeBase *current;
  
  this_00 = this->bailInSymbols;
  pJVar1 = this->func->m_alloc;
  ppSVar4 = SListNodeBase<Memory::ArenaAllocator>::Next
                      (&this_00->super_SListNodeBase<Memory::ArenaAllocator>);
  next = *ppSVar4;
  while (bVar3 = SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
                 ::IsHead(this_00,next), ((bVar3 ^ 0xffU) & 1) != 0) {
    ppSVar4 = SListNodeBase<Memory::ArenaAllocator>::Next(next);
    pSVar2 = *ppSVar4;
    local_68 = (code *)Memory::
                       TypeAllocatorFunc<Memory::ArenaAllocator,_LinearScan::GeneratorBailIn::BailInSymbol>
                       ::GetFreeFunc();
    plVar5 = (long *)((long)&(pJVar1->super_ArenaAllocator).
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             .super_Allocator.outOfMemoryFunc + extraout_RDX);
    if (((ulong)local_68 & 1) != 0) {
      local_68 = *(code **)(local_68 + *plVar5 + -1);
    }
    (*local_68)(plVar5,next,0x20);
    next = pSVar2;
  }
  SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>::Reset
            (this_00);
  SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>::Reset
            (this->bailInSymbols);
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,SListBase<LinearScan::GeneratorBailIn::BailInSymbol,Memory::ArenaAllocator,RealCount>>
            (this->func->m_alloc,this->bailInSymbols);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse(&this->initializedRegs);
  return;
}

Assistant:

LinearScan::GeneratorBailIn::~GeneratorBailIn()
{
    this->bailInSymbols->Clear(this->func->m_alloc);
    this->bailInSymbols->Reset();
    JitAdelete(this->func->m_alloc, this->bailInSymbols);
}